

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

float nk_scrollbar_behavior
                (nk_flags *state,nk_input *in,int has_scrolling,nk_rect *scroll,nk_rect *cursor,
                nk_rect *empty0,nk_rect *empty1,float scroll_offset,float target,float scroll_step,
                nk_orientation o)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  float fVar18;
  float fVar19;
  nk_flags local_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar12 = *state & 2 | 4;
  *state = uVar12;
  if (in == (nk_input *)0x0) {
    return scroll_offset;
  }
  iVar11 = (in->mouse).buttons[0].down;
  uVar2 = cursor->x;
  uVar6 = cursor->y;
  uVar3 = cursor->w;
  uVar7 = cursor->h;
  fVar19 = (in->mouse).buttons[0].clicked_pos.x;
  bVar13 = false;
  if (((float)uVar2 <= fVar19) && (bVar13 = false, fVar19 <= (float)uVar2 + (float)uVar3)) {
    fVar19 = (in->mouse).buttons[0].clicked_pos.y;
    bVar13 = iVar11 == 1 && (fVar19 <= (float)uVar6 + (float)uVar7 && (float)uVar6 <= fVar19);
  }
  uVar4 = scroll->x;
  uVar8 = scroll->y;
  uVar5 = scroll->w;
  uVar9 = scroll->h;
  fVar19 = (in->mouse).pos.x;
  if (((((float)uVar4 <= fVar19) && (fVar19 <= (float)uVar4 + (float)uVar5)) &&
      (fVar19 = (in->mouse).pos.y, (float)uVar8 <= fVar19)) &&
     (fVar19 <= (float)uVar8 + (float)uVar9)) {
    *state = 0x12;
    uVar12 = 0x12;
  }
  if (bVar13 && iVar11 != 0) {
    *state = 0x22;
    if (o == NK_VERTICAL) {
      fVar18 = ((in->mouse).delta.y / (float)uVar9) * target + scroll_offset;
      if (target - (float)uVar9 <= fVar18) {
        fVar18 = target - (float)uVar9;
      }
      fVar19 = 0.0;
      if (0.0 <= fVar18) {
        fVar19 = fVar18;
      }
      (in->mouse).buttons[0].clicked_pos.y =
           (float)uVar7 * 0.5 + (fVar19 / target) * (float)uVar9 + (float)uVar8;
    }
    else {
      fVar18 = scroll->w;
      fVar15 = ((in->mouse).delta.x / fVar18) * target + scroll_offset;
      if (target - fVar18 <= fVar15) {
        fVar15 = target - fVar18;
      }
      fVar19 = 0.0;
      if (0.0 <= fVar15) {
        fVar19 = fVar15;
      }
      (in->mouse).buttons[0].clicked_pos.x =
           cursor->w * 0.5 + (fVar19 / target) * fVar18 + scroll->x;
    }
    uVar16._0_4_ = scroll->x;
    uVar16._4_4_ = scroll->y;
    uVar17._0_4_ = scroll->w;
    uVar17._4_4_ = scroll->h;
    uVar12 = 0x22;
LAB_0013e035:
    fVar18 = (in->mouse).prev.x;
    fVar15 = (float)uVar16 + (float)uVar17;
  }
  else {
    uVar10 = (in->keyboard).keys[0x1d].clicked;
    local_48 = (float)uVar9;
    if ((in->keyboard).keys[0x1d].down == 0) {
      if (1 < uVar10) goto LAB_0013df15;
LAB_0013dfab:
      bVar13 = o == NK_VERTICAL;
      fStack_44 = (float)uVar9;
      fStack_40 = (float)uVar9;
      fStack_3c = (float)uVar9;
      iVar11 = nk_button_behavior(&local_4c,*empty0,in,NK_BUTTON_DEFAULT);
      if (iVar11 != 0) {
        if (!bVar13) {
          local_48 = scroll->w;
        }
        goto LAB_0013e01d;
      }
      uVar10 = (in->keyboard).keys[0x1c].clicked;
      if ((in->keyboard).keys[0x1c].down == 0) {
        bVar14 = 1 < uVar10;
      }
      else {
        bVar14 = uVar10 != 0;
      }
      if (((bool)(bVar14 & bVar13 & has_scrolling != 0)) ||
         (iVar11 = nk_button_behavior(&local_4c,*empty1,in,NK_BUTTON_DEFAULT), iVar11 != 0)) {
        if (bVar13) {
          fVar19 = scroll_offset + local_48;
          if (target - local_48 <= scroll_offset + local_48) {
            fVar19 = target - local_48;
          }
        }
        else {
          fVar19 = scroll_offset + scroll->w;
          fVar18 = target - scroll->w;
          if (fVar18 <= fVar19) {
            fVar19 = fVar18;
          }
        }
      }
      else {
        fVar19 = scroll_offset;
        if (has_scrolling != 0) {
          fVar18 = (in->mouse).scroll_delta;
          if (fVar18 == 0.0) {
            uVar10 = (in->keyboard).keys[0x1a].clicked;
            if ((in->keyboard).keys[0x1a].down == 0) {
              if (uVar10 < 2) goto LAB_0013e1ca;
            }
            else if (uVar10 == 0) {
LAB_0013e1ca:
              uVar10 = (in->keyboard).keys[0x1b].clicked;
              if ((in->keyboard).keys[0x1b].down == 0) {
                bVar14 = 1 < uVar10;
              }
              else {
                bVar14 = uVar10 != 0;
              }
              if (bVar13 && bVar14) {
                fVar19 = target - local_48;
              }
              goto LAB_0013e024;
            }
            if (bVar13) {
              fVar19 = 0.0;
            }
          }
          else {
            fVar18 = scroll_offset - scroll_step * fVar18;
            if (!bVar13) {
              local_48 = scroll->w;
            }
            if (target - local_48 <= fVar18) {
              fVar18 = target - local_48;
            }
            fVar19 = 0.0;
            if (0.0 <= fVar18) {
              fVar19 = fVar18;
            }
          }
        }
      }
    }
    else {
      if (uVar10 == 0) goto LAB_0013dfab;
LAB_0013df15:
      if (has_scrolling == 0 || o != NK_VERTICAL) goto LAB_0013dfab;
LAB_0013e01d:
      fVar19 = scroll_offset - local_48;
      if (scroll_offset - local_48 <= 0.0) {
        fVar19 = 0.0;
      }
    }
LAB_0013e024:
    uVar16._0_4_ = scroll->x;
    uVar16._4_4_ = scroll->y;
    uVar17._0_4_ = scroll->w;
    uVar17._4_4_ = scroll->h;
    if ((uVar12 & 0x10) == 0) goto LAB_0013e035;
    fVar18 = (in->mouse).prev.x;
    if ((fVar18 < (float)(undefined4)uVar16) ||
       (fVar15 = (float)(undefined4)uVar16 + (float)(undefined4)uVar17, fVar15 < fVar18)) {
LAB_0013e0b3:
      uVar12 = uVar12 | 8;
      goto LAB_0013e0b6;
    }
    fVar1 = (in->mouse).prev.y;
    if ((fVar1 < (float)uVar16._4_4_) || ((float)uVar16._4_4_ + (float)uVar17._4_4_ < fVar1))
    goto LAB_0013e0b3;
  }
  if (fVar18 < (float)uVar16) {
    return fVar19;
  }
  if (fVar15 < fVar18) {
    return fVar19;
  }
  fVar15 = (float)((ulong)uVar16 >> 0x20);
  fVar18 = (in->mouse).prev.y;
  if (fVar18 < fVar15) {
    return fVar19;
  }
  if (fVar15 + (float)((ulong)uVar17 >> 0x20) < fVar18) {
    return fVar19;
  }
  uVar12 = uVar12 | 0x40;
LAB_0013e0b6:
  *state = uVar12;
  return fVar19;
}

Assistant:

NK_INTERN float
nk_scrollbar_behavior(nk_flags *state, struct nk_input *in,
    int has_scrolling, const struct nk_rect *scroll,
    const struct nk_rect *cursor, const struct nk_rect *empty0,
    const struct nk_rect *empty1, float scroll_offset,
    float target, float scroll_step, enum nk_orientation o)
{
    nk_flags ws;
    int left_mouse_down;
    int left_mouse_click_in_cursor;

    nk_widget_state_reset(state);
    if (!in) return scroll_offset;

    left_mouse_down = in->mouse.buttons[NK_BUTTON_LEFT].down;
    left_mouse_click_in_cursor = nk_input_has_mouse_click_down_in_rect(in,
        NK_BUTTON_LEFT, *cursor, nk_true);
    if (nk_input_is_mouse_hovering_rect(in, *scroll))
        *state = NK_WIDGET_STATE_HOVERED;

    if (left_mouse_down && left_mouse_click_in_cursor) {
        /* update cursor by mouse dragging */
        float pixel, delta;
        *state = NK_WIDGET_STATE_ACTIVE;
        if (o == NK_VERTICAL) {
            float cursor_y;
            pixel = in->mouse.delta.y;
            delta = (pixel / scroll->h) * target;
            scroll_offset = NK_CLAMP(0, scroll_offset + delta, target - scroll->h);
            cursor_y = scroll->y + ((scroll_offset/target) * scroll->h);
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.y = cursor_y + cursor->h/2.0f;
        } else {
            float cursor_x;
            pixel = in->mouse.delta.x;
            delta = (pixel / scroll->w) * target;
            scroll_offset = NK_CLAMP(0, scroll_offset + delta, target - scroll->w);
            cursor_x = scroll->x + ((scroll_offset/target) * scroll->w);
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.x = cursor_x + cursor->w/2.0f;
        }
    } else if ((nk_input_is_key_pressed(in, NK_KEY_SCROLL_UP) && o == NK_VERTICAL && has_scrolling)||
            nk_button_behavior(&ws, *empty0, in, NK_BUTTON_DEFAULT)) {
        /* scroll page up by click on empty space or shortcut */
        if (o == NK_VERTICAL)
            scroll_offset = NK_MAX(0, scroll_offset - scroll->h);
        else scroll_offset = NK_MAX(0, scroll_offset - scroll->w);
    } else if ((nk_input_is_key_pressed(in, NK_KEY_SCROLL_DOWN) && o == NK_VERTICAL && has_scrolling) ||
        nk_button_behavior(&ws, *empty1, in, NK_BUTTON_DEFAULT)) {
        /* scroll page down by click on empty space or shortcut */
        if (o == NK_VERTICAL)
            scroll_offset = NK_MIN(scroll_offset + scroll->h, target - scroll->h);
        else scroll_offset = NK_MIN(scroll_offset + scroll->w, target - scroll->w);
    } else if (has_scrolling) {
        if ((in->mouse.scroll_delta<0 || (in->mouse.scroll_delta>0))) {
            /* update cursor by mouse scrolling */
            scroll_offset = scroll_offset + scroll_step * (-in->mouse.scroll_delta);
            if (o == NK_VERTICAL)
                scroll_offset = NK_CLAMP(0, scroll_offset, target - scroll->h);
            else scroll_offset = NK_CLAMP(0, scroll_offset, target - scroll->w);
        } else if (nk_input_is_key_pressed(in, NK_KEY_SCROLL_START)) {
            /* update cursor to the beginning  */
            if (o == NK_VERTICAL) scroll_offset = 0;
        } else if (nk_input_is_key_pressed(in, NK_KEY_SCROLL_END)) {
            /* update cursor to the end */
            if (o == NK_VERTICAL) scroll_offset = target - scroll->h;
        }
    }
    if (*state & NK_WIDGET_STATE_HOVER && !nk_input_is_mouse_prev_hovering_rect(in, *scroll))
        *state |= NK_WIDGET_STATE_ENTERED;
    else if (nk_input_is_mouse_prev_hovering_rect(in, *scroll))
        *state |= NK_WIDGET_STATE_LEFT;
    return scroll_offset;
}